

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>::
decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
           *this,int32_t ra,int32_t rb)

{
  int iVar1;
  int32_t error_value_00;
  uint uVar2;
  reference pvVar3;
  size_t *siglen;
  size_t in_R8;
  int32_t error_value;
  int32_t error_value_1;
  int32_t rb_local;
  int32_t ra_local;
  jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::decoder_strategy>
  *this_local;
  
  iVar1 = ra - rb;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if ((this->traits_).near_lossless < iVar1) {
    pvVar3 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,0);
    uVar2 = decode_run_interruption_error(this,pvVar3);
    iVar1 = charls::sign((EVP_PKEY_CTX *)(ulong)(uint)(rb - ra),(uchar *)pvVar3,siglen,
                         (uchar *)(ulong)uVar2,in_R8);
    this_local._7_1_ =
         default_traits<unsigned_char,_unsigned_char>::compute_reconstructed_sample
                   (&this->traits_,rb,uVar2 * iVar1);
  }
  else {
    pvVar3 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,1);
    error_value_00 = decode_run_interruption_error(this,pvVar3);
    this_local._7_1_ =
         default_traits<unsigned_char,_unsigned_char>::compute_reconstructed_sample
                   (&this->traits_,ra,error_value_00);
  }
  return this_local._7_1_;
}

Assistant:

sample_type decode_run_interruption_pixel(int32_t ra, int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{decode_run_interruption_error(context_run_mode_[1])};
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{decode_run_interruption_error(context_run_mode_[0])};
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }